

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearUV
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *a,ImVec2 *b,
               ImVec2 *uv_a,ImVec2 *uv_b,bool clamp)

{
  ImVec2 mx;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImVec2 *in_R9;
  byte in_stack_00000010;
  ImDrawVert *vertex_1;
  ImDrawVert *vertex;
  ImVec2 max;
  ImVec2 min;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  ImVec2 scale;
  ImVec2 uv_size;
  ImVec2 size;
  ImVec2 *in_stack_ffffffffffffff08;
  ImVec2 *pIVar1;
  ImVec2 *in_stack_ffffffffffffff10;
  ImVec2 *in_stack_ffffffffffffff18;
  ImVec2 *v;
  float in_stack_ffffffffffffff28;
  float _y;
  float local_cc;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  float *local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  float *local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  float *local_58;
  float *local_50;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  byte local_29;
  ImVec2 *local_28;
  int local_10;
  int local_c;
  long local_8;
  
  local_29 = in_stack_00000010 & 1;
  local_28 = in_R9;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_34 = ::operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x293612);
  local_3c = ::operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x293630);
  if ((local_34.x != 0.0) || (NAN(local_34.x))) {
    local_cc = local_3c.x / local_34.x;
  }
  else {
    local_cc = 0.0;
  }
  if ((local_34.y != 0.0) || (NAN(local_34.y))) {
    _y = local_3c.y / local_34.y;
  }
  else {
    _y = 0.0;
  }
  ImVec2::ImVec2(&local_44,local_cc,_y);
  local_a8 = (float *)(*(long *)(local_8 + 0x28) + (long)local_c * 0x14);
  local_58 = (float *)(*(long *)(local_8 + 0x28) + (long)local_10 * 0x14);
  local_50 = local_a8;
  if ((local_29 & 1) == 0) {
    for (; local_a8 < local_58; local_a8 = local_a8 + 5) {
      pIVar1 = &local_c8;
      ImVec2::ImVec2(pIVar1,*local_a8,local_a8[1]);
      local_c0 = ::operator-(pIVar1,(ImVec2 *)0x2938b4);
      local_b8 = ImMul(pIVar1,(ImVec2 *)0x2938cc);
      local_b0 = ::operator+(pIVar1,(ImVec2 *)0x2938e1);
      *(ImVec2 *)(local_a8 + 2) = local_b0;
    }
  }
  else {
    local_60 = ImMin(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    local_68 = ImMax(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    for (local_70 = local_50; local_70 < local_58; local_70 = local_70 + 5) {
      pIVar1 = &local_98;
      v = local_28;
      ImVec2::ImVec2(pIVar1,*local_70,local_70[1]);
      local_90 = ::operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x2937c7);
      local_88 = ImMul(in_stack_ffffffffffffff08,(ImVec2 *)0x2937df);
      local_80 = ::operator+(in_stack_ffffffffffffff08,(ImVec2 *)0x2937f4);
      local_a0 = local_68;
      mx.y = _y;
      mx.x = in_stack_ffffffffffffff28;
      local_78 = ImClamp(v,pIVar1,mx);
      *(ImVec2 *)(local_70 + 2) = local_78;
    }
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}